

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightBounds> * __thiscall
pbrt::SpotLight::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,SpotLight *this)

{
  Float FVar1;
  float fVar2;
  Float FVar3;
  float fVar4;
  Float FVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  
  auVar20 = *(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3);
  FVar1 = (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar36._0_12_ = ZEXT812(0);
  auVar36._12_4_ = 0;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar36,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  fVar25 = (this->super_LightBase).renderFromLight.m.m[2][2];
  fVar2 = (this->super_LightBase).renderFromLight.m.m[2][3];
  FVar3 = (this->super_LightBase).renderFromLight.m.m[3][0];
  fVar4 = (this->super_LightBase).renderFromLight.m.m[3][1];
  FVar5 = (this->super_LightBase).renderFromLight.m.m[3][2];
  auVar26 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar32._0_12_ = ZEXT812(0);
  auVar32._12_4_ = 0;
  auVar31._0_4_ = auVar26._0_4_ * 0.0;
  auVar31._4_4_ = auVar26._4_4_ * 0.0;
  auVar31._8_4_ = auVar26._8_4_ * 0.0;
  auVar31._12_4_ = auVar26._12_4_ * 0.0;
  auVar26 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar36 = vfmadd213ps_fma(auVar26,auVar32,auVar31);
  auVar31 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  fVar21 = auVar31._0_4_ + auVar36._0_4_;
  fVar28 = auVar31._4_4_ + auVar36._4_4_;
  fVar29 = auVar31._8_4_ + auVar36._8_4_;
  fVar30 = auVar31._12_4_ + auVar36._12_4_;
  auVar26._0_4_ = fVar21 * fVar21;
  auVar26._4_4_ = fVar28 * fVar28;
  auVar26._8_4_ = fVar29 * fVar29;
  auVar26._12_4_ = fVar30 * fVar30;
  auVar26 = vhaddps_avx(auVar26,auVar26);
  fVar6 = (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar38 = fVar25 + auVar12._0_4_;
  fVar22 = auVar26._0_4_ + fVar38 * fVar38;
  if (fVar22 < 0.0) {
    fVar22 = sqrtf(fVar22);
  }
  else {
    auVar26 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
    fVar22 = auVar26._0_4_;
  }
  pfVar16 = (this->Iemit).values.ptr;
  uVar18 = (this->Iemit).values.nStored;
  if (1 < uVar18) {
    lVar14 = uVar18 * 4 + -4;
    pfVar15 = pfVar16;
    do {
      pfVar15 = pfVar15 + 1;
      pfVar13 = pfVar15;
      if (*pfVar15 <= *pfVar16) {
        pfVar13 = pfVar16;
      }
      pfVar16 = pfVar13;
      lVar14 = lVar14 + -4;
    } while (lVar14 != 0);
  }
  fVar7 = this->scale;
  fVar8 = *pfVar16;
  fVar23 = acosf(this->cosFalloffEnd);
  fVar24 = acosf(this->cosFalloffStart);
  fVar23 = cosf(fVar23 - fVar24);
  if ((fVar23 == 1.0) && (!NAN(fVar23))) {
    if ((this->cosFalloffEnd != this->cosFalloffStart) ||
       (NAN(this->cosFalloffEnd) || NAN(this->cosFalloffStart))) {
      fVar23 = 0.999;
    }
  }
  auVar32 = ZEXT816(0) << 0x40;
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)FVar3),auVar32,ZEXT416((uint)(fVar4 * 0.0)));
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)FVar5),auVar32,auVar26);
  fVar6 = auVar26._0_4_ + fVar6;
  bVar11 = fVar6 == 1.0;
  uVar17 = 0xff;
  if (!bVar11) {
    uVar17 = 0;
  }
  uVar18 = (ulong)uVar17;
  if (NAN(fVar6)) {
    uVar18 = 0;
  }
  auVar26 = vinsertps_avx(auVar20,ZEXT416((uint)FVar1),0x10);
  auVar31 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar31,auVar36);
  auVar34._0_4_ = auVar26._0_4_ + auVar31._0_4_;
  auVar34._4_4_ = auVar26._4_4_ + auVar31._4_4_;
  auVar34._8_4_ = auVar26._8_4_ + auVar31._8_4_;
  auVar34._12_4_ = auVar26._12_4_ + auVar31._12_4_;
  auVar37._4_4_ = fVar6;
  auVar37._0_4_ = fVar6;
  auVar37._8_4_ = fVar6;
  auVar37._12_4_ = fVar6;
  auVar26 = vdivps_avx(auVar34,auVar37);
  bVar10 = (bool)((byte)uVar18 & 1);
  auVar20._0_4_ = (uint)bVar10 * (int)auVar34._0_4_ | (uint)!bVar10 * auVar26._0_4_;
  bVar10 = (bool)((byte)(uVar18 >> 1) & 1);
  auVar20._4_4_ = (uint)bVar10 * (int)auVar34._4_4_ | (uint)!bVar10 * auVar26._4_4_;
  bVar10 = (bool)((byte)(uVar18 >> 2) & 1);
  auVar20._8_4_ = (uint)bVar10 * (int)auVar34._8_4_ | (uint)!bVar10 * auVar26._8_4_;
  bVar10 = (bool)((byte)(uVar18 >> 3) & 1);
  auVar20._12_4_ = (uint)bVar10 * (int)auVar34._12_4_ | (uint)!bVar10 * auVar26._12_4_;
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar25),auVar32,ZEXT416((uint)auVar12._0_4_));
  fVar2 = auVar26._0_4_ + fVar2;
  iVar19 = (uint)bVar11 * (int)fVar2 + (uint)!bVar11 * (int)(fVar2 / fVar6);
  fVar38 = fVar38 / fVar22;
  auVar27._4_4_ = fVar22;
  auVar27._0_4_ = fVar22;
  auVar27._8_4_ = fVar22;
  auVar27._12_4_ = fVar22;
  auVar12._4_4_ = fVar28;
  auVar12._0_4_ = fVar21;
  auVar12._8_4_ = fVar29;
  auVar12._12_4_ = fVar30;
  auVar26 = vdivps_avx(auVar12,auVar27);
  auVar35._0_4_ = auVar26._0_4_ * auVar26._0_4_;
  auVar35._4_4_ = auVar26._4_4_ * auVar26._4_4_;
  auVar35._8_4_ = auVar26._8_4_ * auVar26._8_4_;
  auVar35._12_4_ = auVar26._12_4_ * auVar26._12_4_;
  auVar31 = vhaddps_avx(auVar35,auVar35);
  FVar1 = this->cosFalloffStart;
  fVar25 = fVar38 * fVar38 + auVar31._0_4_;
  if (fVar25 < 0.0) {
    fVar25 = sqrtf(fVar25);
  }
  else {
    auVar31 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
    fVar25 = auVar31._0_4_;
  }
  auVar33._4_4_ = fVar25;
  auVar33._0_4_ = fVar25;
  auVar33._8_4_ = fVar25;
  auVar33._12_4_ = fVar25;
  auVar26 = vdivps_avx(auVar26,auVar33);
  __return_storage_ptr__->set = true;
  uVar9 = vmovlps_avx(auVar20);
  *(undefined8 *)&__return_storage_ptr__->optionalValue = uVar9;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 8) = iVar19;
  uVar9 = vmovlps_avx(auVar20);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc) = uVar9;
  *(int *)((long)&__return_storage_ptr__->optionalValue + 0x14) = iVar19;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar8 * fVar7 * 4.0 * 3.1415927;
  uVar9 = vmovlps_avx(auVar26);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar9;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = fVar38 / fVar25;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = FVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = fVar23;
  (__return_storage_ptr__->optionalValue).__data[0x30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Float phi = scale * Iemit.MaxValue() * 4 * Pi;
    Float cosTheta_e = std::cos(std::acos(cosFalloffEnd) - std::acos(cosFalloffStart));
    // Allow a little slop here to deal with fp round-off error in the computation of
    // cosTheta_p in the importance function.
    if (cosTheta_e == 1 && cosFalloffEnd != cosFalloffStart)
        cosTheta_e = 0.999f;
    return LightBounds(Bounds3f(p, p), w, phi, cosFalloffStart, cosTheta_e, false);
}